

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O2

void __thiscall
asio::detail::
read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>
::operator()(read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
             *this,error_code *ec,size_t bytes_transferred,int start)

{
  int iVar1;
  basic_streambuf<std::allocator<char>_> *pbVar2;
  basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *pbVar3;
  stream_socket_service<asio::ip::tcp> *psVar4;
  HTTPRequester *this_00;
  ulong uVar5;
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
  *this_01;
  undefined8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ptr local_68;
  base_implementation_type *local_48;
  Result result;
  Result local_38;
  
  this->start_ = start;
  uVar5 = this->total_transferred_;
  if (start == 1) {
    if ((ec->_M_value == 0) &&
       (uVar8 = (this->super_base_from_completion_cond<asio::detail::transfer_exactly_t>).
                completion_condition_.size_, uVar7 = uVar8 - uVar5, uVar5 <= uVar8 && uVar7 != 0)) {
      uVar5 = 0x10000;
      if (uVar7 < 0x10000) {
        uVar5 = uVar7;
      }
    }
    else {
      uVar5 = 0;
    }
    pbVar2 = (this->buffers_).sb_;
    lVar10 = *(long *)&pbVar2->field_0x28 - *(long *)&pbVar2->field_0x10;
    uVar7 = pbVar2->max_size_ - lVar10;
    uVar9 = (long)(pbVar2->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage -
            (long)((pbVar2->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar10);
    if (uVar5 <= uVar7) {
      uVar7 = uVar5;
    }
    uVar8 = 0x200;
    if (0x200 < uVar9) {
      uVar8 = uVar9;
    }
    if (uVar7 < uVar8) {
      uVar8 = uVar7;
    }
  }
  else {
    this->total_transferred_ = uVar5 + bytes_transferred;
    basic_streambuf_ref<std::allocator<char>_>::commit(&this->buffers_,bytes_transferred);
    uVar5 = this->total_transferred_;
    iVar1 = ec->_M_value;
    if ((iVar1 == 0) &&
       (uVar8 = (this->super_base_from_completion_cond<asio::detail::transfer_exactly_t>).
                completion_condition_.size_, uVar7 = uVar8 - uVar5, uVar5 <= uVar8 && uVar7 != 0)) {
      uVar8 = 0x10000;
      if (uVar7 < 0x10000) {
        uVar8 = uVar7;
      }
    }
    else {
      uVar8 = 0;
    }
    pbVar2 = (this->buffers_).sb_;
    lVar10 = *(long *)&pbVar2->field_0x28 - *(long *)&pbVar2->field_0x10;
    uVar7 = pbVar2->max_size_ - lVar10;
    uVar9 = (long)(pbVar2->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage -
            (long)((pbVar2->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar10);
    if (uVar8 <= uVar7) {
      uVar7 = uVar8;
    }
    uVar8 = 0x200;
    if (0x200 < uVar9) {
      uVar8 = uVar9;
    }
    if (uVar7 < uVar8) {
      uVar8 = uVar7;
    }
    if ((bytes_transferred == 0 && iVar1 == 0) || (uVar7 == 0)) {
      this_00 = (this->handler_).this;
      this_00->AsyncRefs = this_00->AsyncRefs + -1;
      if (uVar5 == 0 || iVar1 != 0) {
        (**(code **)(*(long *)ec->_M_cat + 0x20))(&local_68);
        iVar1 = ec->_M_value;
        puVar6 = (undefined8 *)operator_new(0x38);
        *puVar6 = "Connection closed";
        std::__cxx11::string::string((string *)(puVar6 + 1),(string *)&local_68);
        *(undefined4 *)(puVar6 + 5) = 2;
        puVar6[6] = (long)iVar1;
        local_38 = (Result)result.Error;
        result.Error = (ErrorResult *)puVar6;
        std::__cxx11::string::~string((string *)&local_68);
        tonk::gateway::HTTPRequester::OnDone(this_00,&result,0,(char *)0x0,0);
        tonk::Result::~Result(&result);
        return;
      }
      tonk::gateway::HTTPRequester::ContinueReadingBody(this_00);
      return;
    }
  }
  pbVar3 = this->stream_;
  _result = (mutable_buffer)
            basic_streambuf_ref<std::allocator<char>_>::prepare(&this->buffers_,uVar8);
  local_48 = &(pbVar3->
              super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>).
              super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.
              implementation_.super_base_implementation_type;
  psVar4 = (pbVar3->super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>).
           super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.service_;
  iVar1 = this->start_;
  local_68.h = this;
  this_01 = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
             *)asio_handler_allocate(0x88,&this->handler_);
  local_68.v = this_01;
  reactive_socket_recv_op_base<asio::mutable_buffers_1>::reactive_socket_recv_op_base
            ((reactive_socket_recv_op_base<asio::mutable_buffers_1> *)this_01,
             (pbVar3->super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>
             ).super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.
             implementation_.super_base_implementation_type.socket_,
             (pbVar3->super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>
             ).super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.
             implementation_.super_base_implementation_type.state_,(mutable_buffers_1 *)&result,0,
             reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>_>
             ::do_complete);
  read_dynbuf_op(&this_01->handler_,this);
  local_68.p = this_01;
  reactive_socket_service_base::start_op
            (&(psVar4->service_impl_).super_reactive_socket_service_base,local_48,0,
             (reactor_op *)this_01,iVar1 == 0,true,
             (bool)(local_38.Error == (ErrorResult *)0x0 &
                   (pbVar3->
                   super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>).
                   super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.
                   implementation_.super_base_implementation_type.state_ >> 4));
  local_68.v = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
                *)0x0;
  local_68.p = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
                *)0x0;
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>_>
  ::ptr::~ptr(&local_68);
  return;
}

Assistant:

void operator()(const asio::error_code& ec,
        std::size_t bytes_transferred, int start = 0)
    {
      std::size_t max_size, bytes_available;
      switch (start_ = start)
      {
        case 1:
        max_size = this->check_for_completion(ec, total_transferred_);
        bytes_available = std::min<std::size_t>(
              std::max<std::size_t>(512,
                buffers_.capacity() - buffers_.size()),
              std::min<std::size_t>(max_size,
                buffers_.max_size() - buffers_.size()));
        for (;;)
        {
          stream_.async_read_some(buffers_.prepare(bytes_available),
              ASIO_MOVE_CAST(read_dynbuf_op)(*this));
          return; default:
          total_transferred_ += bytes_transferred;
          buffers_.commit(bytes_transferred);
          max_size = this->check_for_completion(ec, total_transferred_);
          bytes_available = std::min<std::size_t>(
                std::max<std::size_t>(512,
                  buffers_.capacity() - buffers_.size()),
                std::min<std::size_t>(max_size,
                  buffers_.max_size() - buffers_.size()));
          if ((!ec && bytes_transferred == 0) || bytes_available == 0)
            break;
        }

        handler_(ec, static_cast<const std::size_t&>(total_transferred_));
      }
    }